

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

Node * __thiscall
Node::OutputDefinitionParams_abi_cxx11_(Node *this,Node *MainType,int ExtType,int GlobalStat)

{
  ostream *this_00;
  void *this_01;
  undefined4 in_register_00000014;
  int in_R8D;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [87];
  undefined1 local_29;
  int local_28;
  int local_24;
  int GlobalStat_local;
  int ExtType_local;
  Node *MainType_local;
  Node *this_local;
  string *result;
  
  _GlobalStat_local = (Node *)CONCAT44(in_register_00000014,ExtType);
  local_29 = 0;
  local_28 = in_R8D;
  local_24 = GlobalStat;
  MainType_local = MainType;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  if (MainType->Type == 0x1d8) {
    if (local_28 == 1) {
      std::__cxx11::string::operator=((string *)this,"const ");
    }
    if (MainType->Tree[1] != (Node *)0x0) {
      OutputNodeVarType_abi_cxx11_((Node *)local_80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_80 + 0x20),local_80);
      std::__cxx11::string::operator+=((string *)this,(string *)(local_80 + 0x20));
      std::__cxx11::string::~string((string *)(local_80 + 0x20));
      std::__cxx11::string::~string((string *)local_80);
    }
    if (MainType->Tree[3] != (Node *)0x0) {
      OutputPassmech_abi_cxx11_((Node *)local_a0,(int)MainType->Tree[3]);
      std::__cxx11::string::operator+=((string *)this,(string *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
    if (MainType->Tree[0] != (Node *)0x0) {
      OutputVarName_abi_cxx11_((Node *)local_c0,MainType->Tree[0],(int)MainType->Tree[2]);
      std::__cxx11::string::operator+=((string *)this,(string *)local_c0);
      std::__cxx11::string::~string((string *)local_c0);
    }
    if (MainType->Tree[4] != (Node *)0x0) {
      Expression_abi_cxx11_((Node *)local_100);
      std::operator+(local_100 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14b4e9);
      std::__cxx11::string::operator+=((string *)this,(string *)(local_100 + 0x20));
      std::__cxx11::string::~string((string *)(local_100 + 0x20));
      std::__cxx11::string::~string((string *)local_100);
    }
    if (MainType->Block[0] != (Node *)0x0) {
      OutputDefinitionParams_abi_cxx11_
                ((Node *)local_140,MainType->Block[0],(int)_GlobalStat_local,local_24);
      std::operator+(local_140 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14b665);
      std::__cxx11::string::operator+=((string *)this,(string *)(local_140 + 0x20));
      std::__cxx11::string::~string((string *)(local_140 + 0x20));
      std::__cxx11::string::~string((string *)local_140);
    }
  }
  else if (MainType->Type == 0x1d9) {
    if (MainType->Tree[1] != (Node *)0x0) {
      OutputNodeVarType_abi_cxx11_((Node *)local_180);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_180 + 0x20),local_180);
      std::__cxx11::string::operator+=((string *)this,(string *)(local_180 + 0x20));
      std::__cxx11::string::~string((string *)(local_180 + 0x20));
      std::__cxx11::string::~string((string *)local_180);
    }
    if (MainType->Tree[3] != (Node *)0x0) {
      OutputPassmech_abi_cxx11_((Node *)local_1a0,(int)MainType->Tree[3]);
      std::__cxx11::string::operator+=((string *)this,(string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
    }
    OutputVarName_abi_cxx11_((Node *)local_1c0,MainType->Tree[0],(int)MainType->Tree[2]);
    std::__cxx11::string::operator+=((string *)this,(string *)local_1c0);
    std::__cxx11::string::~string((string *)local_1c0);
    if (MainType->Tree[4] != (Node *)0x0) {
      Expression_abi_cxx11_((Node *)local_200);
      std::operator+(local_200 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14b4e9);
      std::__cxx11::string::operator+=((string *)this,(string *)(local_200 + 0x20));
      std::__cxx11::string::~string((string *)(local_200 + 0x20));
      std::__cxx11::string::~string((string *)local_200);
    }
    if (MainType->Block[0] != (Node *)0x0) {
      OutputDefinitionParams_abi_cxx11_
                ((Node *)local_240,MainType->Block[0],(int)_GlobalStat_local,local_24);
      std::operator+(local_240 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14b665);
      std::__cxx11::string::operator+=((string *)this,(string *)(local_240 + 0x20));
      std::__cxx11::string::~string((string *)(local_240 + 0x20));
      std::__cxx11::string::~string((string *)local_240);
    }
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "Something isn\'t using BAS_V_DEFINE??? (default) @ ");
    this_01 = (void *)std::ostream::operator<<(this_00,MainType->lineno);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    OutputDefinition_abi_cxx11_((Node *)local_280,MainType,(int)_GlobalStat_local);
    std::operator+(local_280 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14ba81);
    std::__cxx11::string::operator+=((string *)this,(string *)(local_280 + 0x20));
    std::__cxx11::string::~string((string *)(local_280 + 0x20));
    std::__cxx11::string::~string((string *)local_280);
  }
  return this;
}

Assistant:

std::string Node::OutputDefinitionParams(
	Node* MainType,		/**< Main data type */
	int ExtType,		/**< Extra data type */
	int GlobalStat		/**< Global status */
)
{
	std::string result;

	switch(Type)
	{
	case BAS_V_DEFINEVAR:
		switch(GlobalStat)
		{
		case 1:		// Constant definition
			result = "const ";
			break;
		}

		if (Tree[1] != 0)
		{
			result += Tree[1]->OutputNodeVarType() + " ";
		}
		if (Tree[3] != 0)
		{
			result += Tree[3]->OutputPassmech(0);
		}
		if (Tree[0] != 0)
		{
			result += Tree[0]->OutputVarName(Tree[2], 1);
		}
		if (Tree[4] != 0)
		{
			result += " = " + Tree[4]->Expression();
		}

		if (Block[0] != 0)
		{
			result += ", " +
				Block[0]->OutputDefinitionParams(MainType, ExtType, GlobalStat);
		}
		break;

	case BAS_V_DEFINEFUN:
		if (Tree[1] != 0)
		{
			result += Tree[1]->OutputNodeVarType() + " ";
		}
		if (Tree[3] != 0)
		{
			result += Tree[3]->OutputPassmech(1);
		}
		result += Tree[0]->OutputVarName(Tree[2], 1);
		if (Tree[4] != 0)
		{
			result += " = " + Tree[4]->Expression();
		}
		if (Block[0] != 0)
		{
			result += ", " +
					Block[0]->OutputDefinitionParams(MainType, ExtType, GlobalStat);
		}
		break;

	default:
std::cerr << "Something isn't using BAS_V_DEFINE??? (default) @ " << lineno << std::endl;
		result += "const " + OutputDefinition(MainType, ExtType);
		break;
	}

	return result;
}